

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

Vec_Int_t * Pdr_ManLitsToCube(Pdr_Man_t *p,int k,int *pArray,int nArray)

{
  uint __line;
  int iVar1;
  char *__assertion;
  ulong uVar2;
  ulong uVar3;
  
  p->vLits->nSize = 0;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < nArray) {
    uVar3 = (ulong)(uint)nArray;
  }
  do {
    if (uVar3 == uVar2) {
      iVar1 = p->vLits->nSize;
      if ((-1 < iVar1) && (iVar1 <= nArray)) {
        return p->vLits;
      }
      __assertion = "Vec_IntSize(p->vLits) >= 0 && Vec_IntSize(p->vLits) <= nArray";
      __line = 0x7f;
LAB_004951c2:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                    ,__line,"Vec_Int_t *Pdr_ManLitsToCube(Pdr_Man_t *, int, int *, int)");
    }
    iVar1 = Pdr_ObjRegNum(p,k,pArray[uVar2] >> 1);
    if (iVar1 != -1) {
      if ((iVar1 < 0) || (p->pAig->nRegs <= iVar1)) {
        __assertion = "RegId >= 0 && RegId < Aig_ManRegNum(p->pAig)";
        __line = 0x7c;
        goto LAB_004951c2;
      }
      Vec_IntPush(p->vLits,(pArray[uVar2] & 1U) + iVar1 * 2 ^ 1);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_ManLitsToCube( Pdr_Man_t * p, int k, int * pArray, int nArray )
{
    int i, RegId;
    Vec_IntClear( p->vLits );
    for ( i = 0; i < nArray; i++ )
    {
        RegId = Pdr_ObjRegNum( p, k, lit_var(pArray[i]) );
        if ( RegId == -1 )
            continue;
        assert( RegId >= 0 && RegId < Aig_ManRegNum(p->pAig) );
        Vec_IntPush( p->vLits, toLitCond(RegId, !lit_sign(pArray[i])) );
    }
    assert( Vec_IntSize(p->vLits) >= 0 && Vec_IntSize(p->vLits) <= nArray );
    return p->vLits;
}